

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_array_equal_real(void)

{
  size_type sVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_07;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_08;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_09;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_10;
  basic_variable<std::allocator<char>_> *local_1430;
  basic_variable<std::allocator<char>_> *local_1418;
  basic_variable<std::allocator<char>_> *local_1400;
  basic_variable<std::allocator<char>_> *local_13e8;
  basic_variable<std::allocator<char>_> *local_13c0;
  basic_variable<std::allocator<char>_> *local_13a8;
  basic_variable<std::allocator<char>_> *local_1390;
  basic_variable<std::allocator<char>_> *local_1378;
  basic_variable<std::allocator<char>_> *local_1360;
  basic_variable<std::allocator<char>_> *local_1348;
  basic_variable<std::allocator<char>_> *local_1330;
  basic_variable<std::allocator<char>_> *local_1318;
  undefined1 local_1309;
  basic_variable<std::allocator<char>_> local_1308;
  basic_variable<std::allocator<char>_> *local_12d0;
  basic_variable<std::allocator<char>_> local_12c8;
  basic_variable<std::allocator<char>_> local_1298;
  basic_variable<std::allocator<char>_> local_1268;
  undefined1 local_1238 [77];
  undefined1 local_11eb [2];
  undefined1 local_11e9;
  basic_variable<std::allocator<char>_> local_11e8;
  basic_variable<std::allocator<char>_> *local_11b0;
  basic_variable<std::allocator<char>_> local_11a8;
  basic_variable<std::allocator<char>_> local_1178;
  basic_variable<std::allocator<char>_> local_1148;
  undefined1 local_1118 [77];
  undefined1 local_10cb [2];
  undefined1 local_10c9;
  basic_variable<std::allocator<char>_> local_10c8;
  basic_variable<std::allocator<char>_> *local_1090;
  basic_variable<std::allocator<char>_> local_1088;
  basic_variable<std::allocator<char>_> local_1058;
  basic_variable<std::allocator<char>_> local_1028;
  undefined1 local_ff8 [77];
  undefined1 local_fab [2];
  undefined1 local_fa9;
  basic_variable<std::allocator<char>_> local_fa8;
  basic_variable<std::allocator<char>_> *local_f70;
  basic_variable<std::allocator<char>_> local_f68;
  basic_variable<std::allocator<char>_> local_f38;
  basic_variable<std::allocator<char>_> local_f08;
  undefined1 local_ed8 [77];
  undefined1 local_e8b [2];
  undefined1 local_e89;
  basic_variable<std::allocator<char>_> local_e88;
  basic_variable<std::allocator<char>_> local_e58;
  undefined1 local_e1b [2];
  undefined1 local_e19;
  basic_variable<std::allocator<char>_> local_e18;
  basic_variable<std::allocator<char>_> local_de8;
  undefined1 local_dab [2];
  undefined1 local_da9;
  basic_variable<std::allocator<char>_> local_da8;
  basic_variable<std::allocator<char>_> local_d78;
  undefined1 local_d3b [2];
  undefined1 local_d39;
  basic_variable<std::allocator<char>_> local_d38;
  basic_variable<std::allocator<char>_> local_d08;
  undefined1 local_cca [10];
  longdouble big_2;
  longdouble zero_2;
  undefined1 local_c99;
  basic_variable<std::allocator<char>_> local_c98;
  basic_variable<std::allocator<char>_> *local_c60;
  basic_variable<std::allocator<char>_> local_c58;
  basic_variable<std::allocator<char>_> local_c28;
  basic_variable<std::allocator<char>_> local_bf8;
  undefined1 local_bc8 [77];
  undefined1 local_b7b [2];
  undefined1 local_b79;
  basic_variable<std::allocator<char>_> local_b78;
  basic_variable<std::allocator<char>_> *local_b40;
  basic_variable<std::allocator<char>_> local_b38;
  basic_variable<std::allocator<char>_> local_b08;
  basic_variable<std::allocator<char>_> local_ad8;
  undefined1 local_aa8 [77];
  undefined1 local_a5b [2];
  undefined1 local_a59;
  basic_variable<std::allocator<char>_> local_a58;
  basic_variable<std::allocator<char>_> *local_a20;
  basic_variable<std::allocator<char>_> local_a18;
  basic_variable<std::allocator<char>_> local_9e8;
  basic_variable<std::allocator<char>_> local_9b8;
  undefined1 local_988 [77];
  undefined1 local_93b [2];
  undefined1 local_939;
  basic_variable<std::allocator<char>_> local_938;
  basic_variable<std::allocator<char>_> *local_900;
  basic_variable<std::allocator<char>_> local_8f8;
  basic_variable<std::allocator<char>_> local_8c8;
  basic_variable<std::allocator<char>_> local_898;
  undefined1 local_868 [77];
  undefined1 local_81b [2];
  undefined1 local_819;
  basic_variable<std::allocator<char>_> local_818;
  basic_variable<std::allocator<char>_> local_7e8;
  undefined1 local_7ab [2];
  undefined1 local_7a9;
  basic_variable<std::allocator<char>_> local_7a8;
  basic_variable<std::allocator<char>_> local_778;
  undefined1 local_73b [2];
  undefined1 local_739;
  basic_variable<std::allocator<char>_> local_738;
  basic_variable<std::allocator<char>_> local_708;
  undefined1 local_6cb [2];
  undefined1 local_6c9;
  basic_variable<std::allocator<char>_> local_6c8;
  basic_variable<std::allocator<char>_> local_698;
  undefined1 local_662 [2];
  double local_660;
  double big_1;
  double zero_1;
  basic_variable<std::allocator<char>_> local_648;
  basic_variable<std::allocator<char>_> *local_610;
  basic_variable<std::allocator<char>_> local_608;
  basic_variable<std::allocator<char>_> local_5d8;
  basic_variable<std::allocator<char>_> local_5a8;
  undefined1 local_578 [77];
  undefined1 local_52b [2];
  undefined1 local_529;
  basic_variable<std::allocator<char>_> local_528;
  basic_variable<std::allocator<char>_> *local_4f0;
  basic_variable<std::allocator<char>_> local_4e8;
  basic_variable<std::allocator<char>_> local_4b8;
  basic_variable<std::allocator<char>_> local_488;
  undefined1 local_458 [77];
  undefined1 local_40b [2];
  undefined1 local_409;
  basic_variable<std::allocator<char>_> local_408;
  basic_variable<std::allocator<char>_> *local_3d0;
  basic_variable<std::allocator<char>_> local_3c8;
  basic_variable<std::allocator<char>_> local_398;
  basic_variable<std::allocator<char>_> local_368;
  undefined1 local_338 [77];
  undefined1 local_2eb [2];
  undefined1 local_2e9;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> *local_2b0;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  basic_variable<std::allocator<char>_> local_248;
  undefined1 local_218 [77];
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  float local_10;
  undefined4 local_c;
  float big;
  float zero;
  
  local_c = 0;
  local_10 = std::numeric_limits<float>::max();
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_78,0.0);
  local_12[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcb2,"void equality_suite::compare_array_equal_real()",local_12,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_e8,0.0);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcb3,"void equality_suite::compare_array_equal_real()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_158,3.4028235e+38);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcb4,"void equality_suite::compare_array_equal_real()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_1c8,3.4028235e+38);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  sVar1 = 0xcb5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcb5,"void equality_suite::compare_array_equal_real()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  local_2b0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,1);
  local_2b0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,2);
  local_2b0 = &local_248;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,3);
  local_218._0_8_ = &local_2a8;
  local_218._8_8_ = 3;
  init._M_len = sVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_array<std::allocator<char>_> *)local_218._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_2e8,0.0);
  local_1cb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),&local_2e8);
  local_2e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcb7,"void equality_suite::compare_array_equal_real()",local_1cb,&local_2e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  pbVar2 = &local_2a8;
  local_1318 = (basic_variable<std::allocator<char>_> *)local_218;
  do {
    local_1318 = local_1318 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1318);
  } while (local_1318 != pbVar2);
  local_3d0 = &local_3c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3d0,1);
  local_3d0 = &local_398;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3d0,2);
  local_3d0 = &local_368;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3d0,3);
  local_338._0_8_ = &local_3c8;
  local_338._8_8_ = 3;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10),
             (basic_array<std::allocator<char>_> *)local_338._0_8_,init_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_408,0.0);
  local_2eb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10),&local_408);
  local_409 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcb8,"void equality_suite::compare_array_equal_real()",local_2eb,&local_409);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  pbVar2 = &local_3c8;
  local_1330 = (basic_variable<std::allocator<char>_> *)local_338;
  do {
    local_1330 = local_1330 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1330);
  } while (local_1330 != pbVar2);
  local_4f0 = &local_4e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,1);
  local_4f0 = &local_4b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,2);
  local_4f0 = &local_488;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,3);
  local_458._0_8_ = &local_4e8;
  local_458._8_8_ = 3;
  init_01._M_len = (size_type)pbVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_458 + 0x10),
             (basic_array<std::allocator<char>_> *)local_458._0_8_,init_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_528,3.4028235e+38);
  local_40b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_458 + 0x10),&local_528);
  local_529 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcb9,"void equality_suite::compare_array_equal_real()",local_40b,&local_529);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_458 + 0x10));
  pbVar2 = &local_4e8;
  local_1348 = (basic_variable<std::allocator<char>_> *)local_458;
  do {
    local_1348 = local_1348 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1348);
  } while (local_1348 != pbVar2);
  local_610 = &local_608;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,1);
  local_610 = &local_5d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,2);
  local_610 = &local_5a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,3);
  local_578._0_8_ = &local_608;
  local_578._8_8_ = 3;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10),
             (basic_array<std::allocator<char>_> *)local_578._0_8_,init_02);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            (&local_648,3.4028235e+38);
  local_52b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10),&local_648);
  zero_1._7_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcba,"void equality_suite::compare_array_equal_real()",local_52b,(long)&zero_1 + 7);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10));
  local_1360 = (basic_variable<std::allocator<char>_> *)local_578;
  do {
    local_1360 = local_1360 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1360);
  } while (local_1360 != &local_608);
  big_1 = 0.0;
  local_660 = std::numeric_limits<double>::max();
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_6c8,0.0);
  local_662[0] = trial::dynamic::operator==(&local_698,&local_6c8);
  local_6c9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcc0,"void equality_suite::compare_array_equal_real()",local_662,&local_6c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_698);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_738,0.0);
  local_6cb[0] = trial::dynamic::operator!=(&local_708,&local_738);
  local_739 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcc1,"void equality_suite::compare_array_equal_real()",local_6cb,&local_739);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_738);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_708);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_7a8,1.79769313486232e+308);
  local_73b[0] = trial::dynamic::operator==(&local_778,&local_7a8);
  local_7a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcc2,"void equality_suite::compare_array_equal_real()",local_73b,&local_7a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_778);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_818,1.79769313486232e+308);
  local_7ab[0] = trial::dynamic::operator!=(&local_7e8,&local_818);
  local_819 = 1;
  sVar1 = 0xcc3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcc3,"void equality_suite::compare_array_equal_real()",local_7ab,&local_819);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_818);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7e8);
  local_900 = &local_8f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_900,1);
  local_900 = &local_8c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_900,2);
  local_900 = &local_898;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_900,3);
  local_868._0_8_ = &local_8f8;
  local_868._8_8_ = 3;
  init_03._M_len = sVar1;
  init_03._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_868 + 0x10),
             (basic_array<std::allocator<char>_> *)local_868._0_8_,init_03);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_938,0.0);
  local_81b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_868 + 0x10),&local_938);
  local_939 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcc5,"void equality_suite::compare_array_equal_real()",local_81b,&local_939);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_868 + 0x10));
  pbVar2 = &local_8f8;
  local_1378 = (basic_variable<std::allocator<char>_> *)local_868;
  do {
    local_1378 = local_1378 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1378);
  } while (local_1378 != pbVar2);
  local_a20 = &local_a18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a20,1);
  local_a20 = &local_9e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a20,2);
  local_a20 = &local_9b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a20,3);
  local_988._0_8_ = &local_a18;
  local_988._8_8_ = 3;
  init_04._M_len = (size_type)pbVar2;
  init_04._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10),
             (basic_array<std::allocator<char>_> *)local_988._0_8_,init_04);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_a58,0.0);
  local_93b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10),&local_a58);
  local_a59 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcc6,"void equality_suite::compare_array_equal_real()",local_93b,&local_a59);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a58);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10));
  pbVar2 = &local_a18;
  local_1390 = (basic_variable<std::allocator<char>_> *)local_988;
  do {
    local_1390 = local_1390 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1390);
  } while (local_1390 != pbVar2);
  local_b40 = &local_b38;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b40,1);
  local_b40 = &local_b08;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b40,2);
  local_b40 = &local_ad8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b40,3);
  local_aa8._0_8_ = &local_b38;
  local_aa8._8_8_ = 3;
  init_05._M_len = (size_type)pbVar2;
  init_05._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_aa8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_aa8._0_8_,init_05);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_b78,1.79769313486232e+308);
  local_a5b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_aa8 + 0x10),&local_b78);
  local_b79 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcc7,"void equality_suite::compare_array_equal_real()",local_a5b,&local_b79);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_aa8 + 0x10));
  pbVar2 = &local_b38;
  local_13a8 = (basic_variable<std::allocator<char>_> *)local_aa8;
  do {
    local_13a8 = local_13a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_13a8);
  } while (local_13a8 != pbVar2);
  local_c60 = &local_c58;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c60,1);
  local_c60 = &local_c28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c60,2);
  local_c60 = &local_bf8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c60,3);
  local_bc8._0_8_ = &local_c58;
  local_bc8._8_8_ = 3;
  init_06._M_len = (size_type)pbVar2;
  init_06._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_bc8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_bc8._0_8_,init_06);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            (&local_c98,1.79769313486232e+308);
  local_b7b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_bc8 + 0x10),&local_c98);
  local_c99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcc8,"void equality_suite::compare_array_equal_real()",local_b7b,&local_c99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c98);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_bc8 + 0x10));
  local_13c0 = (basic_variable<std::allocator<char>_> *)local_bc8;
  do {
    local_13c0 = local_13c0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_13c0);
  } while (local_13c0 != &local_c58);
  unique0x10001c93 = (longdouble)0;
  std::numeric_limits<long_double>::max();
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_d38,(longdouble)0);
  local_cca[0] = trial::dynamic::operator==(&local_d08,&local_d38);
  local_d39 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcce,"void equality_suite::compare_array_equal_real()",local_cca,&local_d39);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d38);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d08);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_da8,(longdouble)0);
  local_d3b[0] = trial::dynamic::operator!=(&local_d78,&local_da8);
  local_da9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xccf,"void equality_suite::compare_array_equal_real()",local_d3b,&local_da9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_da8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d78);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_e18,_DAT_00223040);
  local_dab[0] = trial::dynamic::operator==(&local_de8,&local_e18);
  local_e19 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcd0,"void equality_suite::compare_array_equal_real()",local_dab,&local_e19);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e18);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_de8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_e88,_DAT_00223040);
  local_e1b[0] = trial::dynamic::operator!=(&local_e58,&local_e88);
  local_e89 = 1;
  sVar1 = 0xcd1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcd1,"void equality_suite::compare_array_equal_real()",local_e1b,&local_e89);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e58);
  local_f70 = &local_f68;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_f70,1);
  local_f70 = &local_f38;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_f70,2);
  local_f70 = &local_f08;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_f70,3);
  local_ed8._0_8_ = &local_f68;
  local_ed8._8_8_ = 3;
  init_07._M_len = sVar1;
  init_07._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_ed8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_ed8._0_8_,init_07);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_fa8,(longdouble)0);
  local_e8b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_ed8 + 0x10),&local_fa8);
  local_fa9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(zero)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcd3,"void equality_suite::compare_array_equal_real()",local_e8b,&local_fa9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_fa8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_ed8 + 0x10));
  pbVar2 = &local_f68;
  local_13e8 = (basic_variable<std::allocator<char>_> *)local_ed8;
  do {
    local_13e8 = local_13e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_13e8);
  } while (local_13e8 != pbVar2);
  local_1090 = &local_1088;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1090,1);
  local_1090 = &local_1058;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1090,2);
  local_1090 = &local_1028;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1090,3);
  local_ff8._0_8_ = &local_1088;
  local_ff8._8_8_ = 3;
  init_08._M_len = (size_type)pbVar2;
  init_08._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_ff8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_ff8._0_8_,init_08);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_10c8,(longdouble)0);
  local_fab[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_ff8 + 0x10),&local_10c8)
  ;
  local_10c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(zero)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcd4,"void equality_suite::compare_array_equal_real()",local_fab,&local_10c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_10c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_ff8 + 0x10));
  pbVar2 = &local_1088;
  local_1400 = (basic_variable<std::allocator<char>_> *)local_ff8;
  do {
    local_1400 = local_1400 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1400);
  } while (local_1400 != pbVar2);
  local_11b0 = &local_11a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_11b0,1);
  local_11b0 = &local_1178;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_11b0,2);
  local_11b0 = &local_1148;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_11b0,3);
  local_1118._0_8_ = &local_11a8;
  local_1118._8_8_ = 3;
  init_09._M_len = (size_type)pbVar2;
  init_09._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1118 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1118._0_8_,init_09);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_11e8,_DAT_00223040);
  local_10cb[0] =
       trial::dynamic::operator==
                 ((basic_variable<std::allocator<char>_> *)(local_1118 + 0x10),&local_11e8);
  local_11e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcd5,"void equality_suite::compare_array_equal_real()",local_10cb,&local_11e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_11e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1118 + 0x10));
  pbVar2 = &local_11a8;
  local_1418 = (basic_variable<std::allocator<char>_> *)local_1118;
  do {
    local_1418 = local_1418 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1418);
  } while (local_1418 != pbVar2);
  local_12d0 = &local_12c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_12d0,1);
  local_12d0 = &local_1298;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_12d0,2);
  local_12d0 = &local_1268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_12d0,3);
  local_1238._0_8_ = &local_12c8;
  local_1238._8_8_ = 3;
  init_10._M_len = (size_type)pbVar2;
  init_10._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1238 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1238._0_8_,init_10);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_1308,_DAT_00223040);
  local_11eb[0] =
       trial::dynamic::operator!=
                 ((basic_variable<std::allocator<char>_> *)(local_1238 + 0x10),&local_1308);
  local_1309 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcd6,"void equality_suite::compare_array_equal_real()",local_11eb,&local_1309);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1308);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1238 + 0x10));
  local_1430 = (basic_variable<std::allocator<char>_> *)local_1238;
  do {
    local_1430 = local_1430 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1430);
  } while (local_1430 != &local_12c8);
  return;
}

Assistant:

void compare_array_equal_real()
{
    {
        const auto zero = 0.0f;
        const auto big = std::numeric_limits<float>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(big), true);
    }
    {
        const auto zero = 0.0;
        const auto big = std::numeric_limits<double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(big), true);
    }
    {
        const auto zero = 0.0L;
        const auto big = std::numeric_limits<long double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(zero), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(zero), true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(big), true);
    }
}